

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineoption.cpp
# Opt level: O3

QStringList *
QCommandLineOptionPrivate::removeInvalidNames
          (QStringList *__return_storage_ptr__,QStringList nameList)

{
  ulong uVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  Data *pDVar5;
  result_type rVar6;
  iterator aend;
  iterator iVar7;
  long lVar8;
  QString *pQVar9;
  QList<QString> *in_RSI;
  ulong uVar10;
  const_iterator abegin;
  QString *pQVar11;
  long lVar12;
  QString *pQVar13;
  
  uVar1 = (in_RSI->d).size;
  if (uVar1 == 0) {
    lVar8 = 0;
    goto LAB_001074dd;
  }
  pQVar9 = (in_RSI->d).ptr;
  lVar8 = uVar1 * 0x18;
  uVar10 = uVar1;
  pQVar11 = pQVar9;
  if (3 < uVar1) {
    lVar12 = (uVar1 >> 2) + 1;
    pQVar11 = pQVar9 + 2;
    do {
      pQVar13 = pQVar11;
      rVar6 = anon_unknown.dwarf_5c2fa7::IsInvalidName::operator()
                        ((IsInvalidName *)pQVar13[-2].d.ptr,(QString *)pQVar13[-2].d.size);
      if (rVar6) {
        pQVar13 = pQVar13 + -2;
        goto LAB_00107443;
      }
      rVar6 = anon_unknown.dwarf_5c2fa7::IsInvalidName::operator()
                        ((IsInvalidName *)pQVar13[-1].d.ptr,(QString *)pQVar13[-1].d.size);
      if (rVar6) {
        pQVar13 = pQVar13 + -1;
        goto LAB_00107443;
      }
      rVar6 = anon_unknown.dwarf_5c2fa7::IsInvalidName::operator()
                        ((IsInvalidName *)(pQVar13->d).ptr,(QString *)(pQVar13->d).size);
      if (rVar6) goto LAB_00107443;
      rVar6 = anon_unknown.dwarf_5c2fa7::IsInvalidName::operator()
                        ((IsInvalidName *)pQVar13[1].d.ptr,(QString *)pQVar13[1].d.size);
      if (rVar6) {
        pQVar13 = pQVar13 + 1;
        goto LAB_00107443;
      }
      lVar12 = lVar12 + -1;
      lVar8 = lVar8 + -0x60;
      pQVar11 = pQVar13 + 4;
    } while (1 < lVar12);
    uVar10 = lVar8 / 0x18;
    pQVar11 = pQVar13 + 2;
  }
  if (uVar10 == 1) {
LAB_0010740f:
    rVar6 = anon_unknown.dwarf_5c2fa7::IsInvalidName::operator()
                      ((IsInvalidName *)(pQVar11->d).ptr,(QString *)(pQVar11->d).size);
    pQVar13 = pQVar11;
    if (!rVar6) {
      pQVar13 = pQVar9 + uVar1;
    }
  }
  else if (uVar10 == 2) {
LAB_001073f5:
    rVar6 = anon_unknown.dwarf_5c2fa7::IsInvalidName::operator()
                      ((IsInvalidName *)(pQVar11->d).ptr,(QString *)(pQVar11->d).size);
    pQVar13 = pQVar11;
    if (!rVar6) {
      pQVar11 = pQVar11 + 1;
      goto LAB_0010740f;
    }
  }
  else {
    pQVar13 = pQVar9 + uVar1;
    if ((uVar10 == 3) &&
       (rVar6 = anon_unknown.dwarf_5c2fa7::IsInvalidName::operator()
                          ((IsInvalidName *)(pQVar11->d).ptr,(QString *)(pQVar11->d).size),
       pQVar13 = pQVar11, !rVar6)) {
      pQVar11 = pQVar11 + 1;
      goto LAB_001073f5;
    }
  }
LAB_00107443:
  lVar12 = (long)pQVar13 - (long)pQVar9;
  lVar8 = lVar12 / 0x18;
  if (lVar8 != (in_RSI->d).size) {
    aend = QList<QString>::end(in_RSI);
    iVar7 = QList<QString>::begin(in_RSI);
    abegin.i = (QString *)((long)iVar7.i + lVar12);
    pQVar9 = (QString *)((long)iVar7.i + lVar12);
    while (pQVar11 = pQVar9, pQVar9 = pQVar11 + 1, pQVar9 != aend.i) {
      rVar6 = anon_unknown.dwarf_5c2fa7::IsInvalidName::operator()
                        ((IsInvalidName *)pQVar11[1].d.ptr,(QString *)pQVar11[1].d.size);
      if (!rVar6) {
        pDVar2 = ((abegin.i)->d).d;
        ((abegin.i)->d).d = (pQVar9->d).d;
        (pQVar9->d).d = pDVar2;
        pcVar3 = ((abegin.i)->d).ptr;
        ((abegin.i)->d).ptr = pQVar11[1].d.ptr;
        pQVar11[1].d.ptr = pcVar3;
        qVar4 = ((abegin.i)->d).size;
        ((abegin.i)->d).size = pQVar11[1].d.size;
        pQVar11[1].d.size = qVar4;
        abegin.i = abegin.i + 1;
      }
    }
    QList<QString>::erase(in_RSI,abegin,(const_iterator)aend.i);
    lVar8 = (in_RSI->d).size;
  }
LAB_001074dd:
  pDVar5 = (in_RSI->d).d;
  pQVar9 = (in_RSI->d).ptr;
  (in_RSI->d).d = (Data *)0x0;
  (in_RSI->d).ptr = (QString *)0x0;
  (__return_storage_ptr__->d).d = pDVar5;
  (__return_storage_ptr__->d).ptr = pQVar9;
  (in_RSI->d).size = 0;
  (__return_storage_ptr__->d).size = lVar8;
  return __return_storage_ptr__;
}

Assistant:

QStringList QCommandLineOptionPrivate::removeInvalidNames(QStringList nameList)
{
    if (Q_UNLIKELY(nameList.isEmpty()))
        qWarning("QCommandLineOption: Options must have at least one name");
    else
        nameList.removeIf(IsInvalidName());
    return nameList;
}